

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void set_dialog_position(Am_Object *the_dialog,int x,int y)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object *this;
  
  if (x == -10000) {
    pAVar3 = Am_Object::Get(&Am_Screen,0x66,0);
    iVar1 = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(the_dialog,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    x = (iVar1 - iVar2) / 2;
  }
  if (y == -10000) {
    pAVar3 = Am_Object::Get(&Am_Screen,0x67,0);
    iVar1 = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(the_dialog,0x67,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    y = (iVar1 - iVar2) / 2;
  }
  this = Am_Object::Set(the_dialog,100,x,0);
  Am_Object::Set(this,0x65,y,0);
  return;
}

Assistant:

static void
set_dialog_position(Am_Object &the_dialog, int x, int y)
{
  if (x == Am_AT_CENTER_SCREEN)
    x = ((int)Am_Screen.Get(Am_WIDTH) - (int)the_dialog.Get(Am_WIDTH)) / 2;
  if (y == Am_AT_CENTER_SCREEN)
    y = ((int)Am_Screen.Get(Am_HEIGHT) - (int)the_dialog.Get(Am_HEIGHT)) / 2;
  the_dialog.Set(Am_LEFT, x).Set(Am_TOP, y);
}